

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall ON_BoundingBox::Intersection(ON_BoundingBox *this,ON_BoundingBox *a)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  ON_BoundingBox *a_local;
  ON_BoundingBox *this_local;
  
  bVar3 = IsValid(this);
  if ((bVar3) && (bVar3 = IsValid(a), bVar3)) {
    dVar2 = (a->m_min).x;
    if ((this->m_min).x <= dVar2 && dVar2 != (this->m_min).x) {
      (this->m_min).x = (a->m_min).x;
    }
    dVar2 = (a->m_min).y;
    pdVar1 = &(this->m_min).y;
    if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
      (this->m_min).y = (a->m_min).y;
    }
    dVar2 = (a->m_min).z;
    pdVar1 = &(this->m_min).z;
    if (*pdVar1 <= dVar2 && dVar2 != *pdVar1) {
      (this->m_min).z = (a->m_min).z;
    }
    if ((a->m_max).x < (this->m_max).x) {
      (this->m_max).x = (a->m_max).x;
    }
    if ((a->m_max).y < (this->m_max).y) {
      (this->m_max).y = (a->m_max).y;
    }
    if ((a->m_max).z < (this->m_max).z) {
      (this->m_max).z = (a->m_max).z;
    }
  }
  else {
    Destroy(this);
  }
  bVar3 = IsValid(this);
  return bVar3;
}

Assistant:

bool ON_BoundingBox::Intersection(
          const ON_BoundingBox& a
          )
{
  if ( IsValid() && a.IsValid() ) {
    if ( a.m_min.x > m_min.x )
      m_min.x = a.m_min.x;
    if ( a.m_min.y > m_min.y )
      m_min.y = a.m_min.y;
    if ( a.m_min.z > m_min.z )
      m_min.z = a.m_min.z;
    if ( a.m_max.x < m_max.x )
      m_max.x = a.m_max.x;
    if ( a.m_max.y < m_max.y )
      m_max.y = a.m_max.y;
    if ( a.m_max.z < m_max.z )
      m_max.z = a.m_max.z;
  }
  else {
    Destroy();
  }
  return IsValid();
}